

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::GetTargetDirectDepends
          (cmComputeTargetDepends *this,cmGeneratorTarget *t,cmTargetDependSet *deps)

{
  pointer pcVar1;
  pointer pcVar2;
  iterator iVar3;
  _Rb_tree_iterator<cmTargetDepend> _Var4;
  pointer pcVar5;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar6;
  cmGeneratorTarget *local_58;
  cmTargetDepend local_50;
  
  local_58 = t;
  iVar3 = std::
          _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
          ::find(&(this->TargetIndex)._M_t,&local_58);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header) {
    pcVar1 = (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = *(pointer *)
              ((long)&pcVar1[(long)iVar3._M_node[1]._M_parent].
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar5 = *(pointer *)
                   &pcVar1[(long)iVar3._M_node[1]._M_parent].
                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pcVar5 != pcVar2;
        pcVar5 = pcVar5 + 1) {
      cmTargetDepend::cmTargetDepend
                (&local_50,
                 (this->Targets).
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[pcVar5->Dest]);
      pVar6 = std::
              _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
              ::_M_insert_unique<cmTargetDepend>
                        ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          *)deps,&local_50);
      _Var4 = pVar6.first._M_node;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if (pcVar5->Strong == true) {
        *(undefined1 *)((long)&_Var4._M_node[1]._M_parent + 1) = 1;
      }
      else {
        *(undefined1 *)&_Var4._M_node[1]._M_parent = 1;
      }
      *(bool *)((long)&_Var4._M_node[1]._M_parent + 2) = pcVar5->Cross;
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   *)&_Var4._M_node[1]._M_left,
                  (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   *)&pcVar5->Backtrace);
    }
    return;
  }
  __assert_fail("tii != this->TargetIndex.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmComputeTargetDepends.cxx"
                ,0xa2,
                "void cmComputeTargetDepends::GetTargetDirectDepends(const cmGeneratorTarget *, cmTargetDependSet &)"
               );
}

Assistant:

void cmComputeTargetDepends::GetTargetDirectDepends(cmGeneratorTarget const* t,
                                                    cmTargetDependSet& deps)
{
  // Lookup the index for this target.  All targets should be known by
  // this point.
  auto tii = this->TargetIndex.find(t);
  assert(tii != this->TargetIndex.end());
  size_t i = tii->second;

  // Get its final dependencies.
  EdgeList const& nl = this->FinalGraph[i];
  for (cmGraphEdge const& ni : nl) {
    cmGeneratorTarget const* dep = this->Targets[ni];
    auto di = deps.insert(dep).first;
    di->SetType(ni.IsStrong());
    di->SetCross(ni.IsCross());
    di->SetBacktrace(ni.GetBacktrace());
  }
}